

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall
StringWriter_ReadCharString_Test::~StringWriter_ReadCharString_Test
          (StringWriter_ReadCharString_Test *this)

{
  StringWriter_ReadCharString_Test *this_local;
  
  anon_unknown.dwarf_228fb::StringWriter::~StringWriter(&this->super_StringWriter);
  return;
}

Assistant:

TEST_F (StringWriter, ReadCharString) {
    std::string const str{"hello"};
    pstore::serialize::write (writer_, str);

    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    std::string const actual = pstore::serialize::read<std::string> (archive);
    EXPECT_EQ (str, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}